

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O1

Matrix4f *
Matrix4f::orthographicProjection
          (Matrix4f *__return_storage_ptr__,float width,float height,float zNear,float zFar,
          bool directX)

{
  undefined8 uVar1;
  float fVar2;
  undefined3 in_register_00000031;
  Matrix4f *m;
  undefined1 auVar3 [16];
  
  __return_storage_ptr__->m_elements[0] = 0.0;
  __return_storage_ptr__->m_elements[1] = 0.0;
  __return_storage_ptr__->m_elements[2] = 0.0;
  __return_storage_ptr__->m_elements[3] = 0.0;
  __return_storage_ptr__->m_elements[4] = 0.0;
  __return_storage_ptr__->m_elements[5] = 0.0;
  __return_storage_ptr__->m_elements[6] = 0.0;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = 0.0;
  __return_storage_ptr__->m_elements[9] = 0.0;
  __return_storage_ptr__->m_elements[10] = 0.0;
  __return_storage_ptr__->m_elements[0xb] = 0.0;
  __return_storage_ptr__->m_elements[0xc] = 0.0;
  __return_storage_ptr__->m_elements[0xd] = 0.0;
  __return_storage_ptr__->m_elements[0xe] = 0.0;
  __return_storage_ptr__->m_elements[0xf] = 0.0;
  __return_storage_ptr__->m_elements[0] = 2.0 / width;
  __return_storage_ptr__->m_elements[5] = 2.0 / height;
  __return_storage_ptr__->m_elements[0xf] = 1.0;
  auVar3._8_4_ = 0xbf800000;
  auVar3._0_8_ = 0xbf800000bf800000;
  auVar3._12_4_ = 0xbf800000;
  uVar1 = vmovlps_avx(auVar3);
  *(undefined8 *)(__return_storage_ptr__->m_elements + 0xc) = uVar1;
  fVar2 = zNear - zFar;
  if (CONCAT31(in_register_00000031,directX) == 0) {
    __return_storage_ptr__->m_elements[10] = 2.0 / fVar2;
    zNear = zNear + zFar;
  }
  else {
    __return_storage_ptr__->m_elements[10] = 1.0 / fVar2;
  }
  __return_storage_ptr__->m_elements[0xe] = zNear / fVar2;
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::orthographicProjection( float width, float height, float zNear, float zFar, bool directX )
{
	Matrix4f m;

	m( 0, 0 ) = 2.0f / width;
	m( 1, 1 ) = 2.0f / height;
	m( 3, 3 ) = 1.0f;

	m( 0, 3 ) = -1;
	m( 1, 3 ) = -1;

	if( directX )
	{
		m( 2, 2 ) = 1.0f / ( zNear - zFar );
		m( 2, 3 ) = zNear / ( zNear - zFar );
	}
	else
	{
		m( 2, 2 ) = 2.0f / ( zNear - zFar );
		m( 2, 3 ) = ( zNear + zFar ) / ( zNear - zFar );
	}

	return m;
}